

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Sigmoid_x86_avx::forward_inplace(Sigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  float *pfVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  float fVar35;
  float fVar37;
  float fVar38;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar36 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar31 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  float fVar61;
  float fVar66;
  float fVar67;
  undefined1 auVar62 [16];
  float fVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 in_ZMM14 [64];
  undefined1 local_108 [16];
  float local_b8;
  undefined1 auVar28 [32];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar45 [32];
  undefined1 auVar47 [32];
  
  uVar10 = bottom_top_blob->c;
  uVar12 = (ulong)uVar10;
  uVar11 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar10) {
      auVar60 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                   CONCAT424(0x42b0c0a5,
                                             CONCAT420(0x42b0c0a5,
                                                       CONCAT416(0x42b0c0a5,
                                                                 CONCAT412(0x42b0c0a5,
                                                                           CONCAT48(0x42b0c0a5,
                                                                                                                                                                        
                                                  0x42b0c0a542b0c0a5)))))));
      auVar52 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                   CONCAT424(0xc2b0c0a5,
                                             CONCAT420(0xc2b0c0a5,
                                                       CONCAT416(0xc2b0c0a5,
                                                                 CONCAT412(0xc2b0c0a5,
                                                                           CONCAT48(0xc2b0c0a5,
                                                                                                                                                                        
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar55._8_4_ = 0x3f800000;
      auVar55._0_8_ = 0x3f8000003f800000;
      auVar55._12_4_ = 0x3f800000;
      auVar55._16_4_ = 0x3f800000;
      auVar55._20_4_ = 0x3f800000;
      auVar55._24_4_ = 0x3f800000;
      auVar55._28_4_ = 0x3f800000;
      uVar5 = 0;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar11) {
          pfVar9 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                            (long)bottom_top_blob->data);
          uVar10 = uVar11;
          do {
            auVar72._0_8_ = *(ulong *)pfVar9 ^ 0x8000000080000000;
            auVar72._8_4_ = -pfVar9[2];
            auVar72._12_4_ = -pfVar9[3];
            auVar72._16_4_ = -pfVar9[4];
            auVar72._20_4_ = -pfVar9[5];
            auVar72._24_4_ = -pfVar9[6];
            auVar72._28_4_ = -pfVar9[7];
            auVar72 = vminps_avx(auVar72,auVar60._0_32_);
            auVar1 = vmaxps_avx(auVar72,auVar52._0_32_);
            auVar76._0_4_ = auVar1._0_4_ * 1.442695 + 0.5;
            auVar76._4_4_ = auVar1._4_4_ * 1.442695 + 0.5;
            auVar76._8_4_ = auVar1._8_4_ * 1.442695 + 0.5;
            auVar76._12_4_ = auVar1._12_4_ * 1.442695 + 0.5;
            auVar76._16_4_ = auVar1._16_4_ * 1.442695 + 0.5;
            auVar76._20_4_ = auVar1._20_4_ * 1.442695 + 0.5;
            auVar76._24_4_ = auVar1._24_4_ * 1.442695 + 0.5;
            auVar76._28_4_ = in_ZMM14._28_4_ + 0.5;
            auVar45 = vroundps_avx(auVar76,1);
            auVar72 = vcmpps_avx(auVar76,auVar45,1);
            auVar72 = vandps_avx(auVar72,auVar55);
            auVar72 = vsubps_avx(auVar45,auVar72);
            fVar61 = auVar1._0_4_ + auVar72._0_4_ * -0.6931472;
            fVar66 = auVar1._4_4_ + auVar72._4_4_ * -0.6931472;
            fVar67 = auVar1._8_4_ + auVar72._8_4_ * -0.6931472;
            fVar68 = auVar1._12_4_ + auVar72._12_4_ * -0.6931472;
            fVar35 = auVar1._16_4_ + auVar72._16_4_ * -0.6931472;
            fVar37 = auVar1._20_4_ + auVar72._20_4_ * -0.6931472;
            fVar38 = auVar1._24_4_ + auVar72._24_4_ * -0.6931472;
            auVar49._0_4_ = (int)auVar72._0_4_;
            auVar49._4_4_ = (int)auVar72._4_4_;
            auVar49._8_4_ = (int)auVar72._8_4_;
            auVar49._12_4_ = (int)auVar72._12_4_;
            auVar73._16_4_ = (int)auVar72._16_4_;
            auVar73._0_16_ = auVar49;
            auVar73._20_4_ = (int)auVar72._20_4_;
            auVar73._24_4_ = (int)auVar72._24_4_;
            auVar73._28_4_ = (int)auVar72._28_4_;
            auVar75 = vpslld_avx(auVar49,0x17);
            auVar49 = vpslld_avx(auVar73._16_16_,0x17);
            auVar49 = vpaddd_avx(auVar49,auVar71);
            auVar75 = vpaddd_avx(auVar75,auVar71);
            in_ZMM14 = ZEXT1664(auVar75);
            auVar22._0_4_ =
                 auVar75._0_4_ *
                 (fVar61 + 1.0 +
                 fVar61 * fVar61 *
                 (fVar61 * (fVar61 * (fVar61 * (fVar61 * (fVar61 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar22._4_4_ =
                 auVar75._4_4_ *
                 (fVar66 + 1.0 +
                 fVar66 * fVar66 *
                 (fVar66 * (fVar66 * (fVar66 * (fVar66 * (fVar66 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar22._8_4_ =
                 auVar75._8_4_ *
                 (fVar67 + 1.0 +
                 fVar67 * fVar67 *
                 (fVar67 * (fVar67 * (fVar67 * (fVar67 * (fVar67 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar22._12_4_ =
                 auVar75._12_4_ *
                 (fVar68 + 1.0 +
                 fVar68 * fVar68 *
                 (fVar68 * (fVar68 * (fVar68 * (fVar68 * (fVar68 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar22._16_4_ =
                 auVar49._0_4_ *
                 (fVar35 + 1.0 +
                 fVar35 * fVar35 *
                 (fVar35 * (fVar35 * (fVar35 * (fVar35 * (fVar35 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar22._20_4_ =
                 auVar49._4_4_ *
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (fVar37 * (fVar37 * (fVar37 * (fVar37 * (fVar37 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar22._24_4_ =
                 auVar49._8_4_ *
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (fVar38 * (fVar38 * (fVar38 * (fVar38 * (fVar38 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar22._28_4_ = auVar1._28_4_ + auVar45._28_4_ + 1.0 + 0.71826285 + 1.0;
            auVar72 = vrcpps_avx(auVar22);
            fVar61 = auVar72._0_4_;
            fVar66 = auVar72._4_4_;
            auVar1._4_4_ = fVar66 * auVar22._4_4_;
            auVar1._0_4_ = fVar61 * auVar22._0_4_;
            fVar67 = auVar72._8_4_;
            auVar1._8_4_ = fVar67 * auVar22._8_4_;
            fVar68 = auVar72._12_4_;
            auVar1._12_4_ = fVar68 * auVar22._12_4_;
            fVar35 = auVar72._16_4_;
            auVar1._16_4_ = fVar35 * auVar22._16_4_;
            fVar37 = auVar72._20_4_;
            auVar1._20_4_ = fVar37 * auVar22._20_4_;
            fVar38 = auVar72._24_4_;
            auVar1._24_4_ = fVar38 * auVar22._24_4_;
            auVar1._28_4_ = auVar22._28_4_;
            auVar1 = vsubps_avx(auVar55,auVar1);
            *pfVar9 = fVar61 + fVar61 * auVar1._0_4_;
            pfVar9[1] = fVar66 + fVar66 * auVar1._4_4_;
            pfVar9[2] = fVar67 + fVar67 * auVar1._8_4_;
            pfVar9[3] = fVar68 + fVar68 * auVar1._12_4_;
            pfVar9[4] = fVar35 + fVar35 * auVar1._16_4_;
            pfVar9[5] = fVar37 + fVar37 * auVar1._20_4_;
            pfVar9[6] = fVar38 + fVar38 * auVar1._24_4_;
            pfVar9[7] = auVar72._28_4_ + auVar1._28_4_;
            auVar60 = ZEXT3264(auVar60._0_32_);
            auVar52 = ZEXT3264(auVar52._0_32_);
            pfVar9 = pfVar9 + 8;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar12);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar10) {
      uVar5 = 0;
      auVar39._8_4_ = 0x42b0c0a5;
      auVar39._0_8_ = 0x42b0c0a542b0c0a5;
      auVar39._12_4_ = 0x42b0c0a5;
      auVar48._8_4_ = 0xc2b0c0a5;
      auVar48._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar48._12_4_ = 0xc2b0c0a5;
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = 0x3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar11) {
          pauVar8 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          uVar10 = uVar11;
          do {
            auVar71 = *pauVar8;
            auVar62._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
            auVar62._8_4_ = auVar71._8_4_ ^ 0x80000000;
            auVar62._12_4_ = auVar71._12_4_ ^ 0x80000000;
            auVar71 = vminps_avx(auVar62,auVar39);
            auVar75 = vmaxps_avx(auVar71,auVar48);
            auVar69._0_4_ = auVar75._0_4_ * 1.442695 + 0.5;
            auVar69._4_4_ = auVar75._4_4_ * 1.442695 + 0.5;
            auVar69._8_4_ = auVar75._8_4_ * 1.442695 + 0.5;
            auVar69._12_4_ = auVar75._12_4_ * 1.442695 + 0.5;
            auVar74._0_4_ = (int)auVar69._0_4_;
            auVar74._4_4_ = (int)auVar69._4_4_;
            auVar74._8_4_ = (int)auVar69._8_4_;
            auVar74._12_4_ = (int)auVar69._12_4_;
            auVar49 = vcvtdq2ps_avx(auVar74);
            auVar71 = vcmpps_avx(auVar69,auVar49,1);
            auVar71 = vandps_avx(auVar71,auVar53);
            auVar71 = vsubps_avx(auVar49,auVar71);
            fVar61 = auVar75._0_4_ + auVar71._0_4_ * -0.6931472;
            fVar66 = auVar75._4_4_ + auVar71._4_4_ * -0.6931472;
            fVar67 = auVar75._8_4_ + auVar71._8_4_ * -0.6931472;
            fVar68 = auVar75._12_4_ + auVar71._12_4_ * -0.6931472;
            auVar70._0_4_ = (int)auVar71._0_4_;
            auVar70._4_4_ = (int)auVar71._4_4_;
            auVar70._8_4_ = (int)auVar71._8_4_;
            auVar70._12_4_ = (int)auVar71._12_4_;
            auVar71 = vpslld_avx(auVar70,0x17);
            auVar71 = vpaddd_avx(auVar71,auVar53);
            auVar63._0_4_ =
                 (fVar61 + 1.0 +
                 fVar61 * fVar61 *
                 (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                   0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5)) * auVar71._0_4_ + 1.0;
            auVar63._4_4_ =
                 (fVar66 + 1.0 +
                 fVar66 * fVar66 *
                 (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                   0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5)) * auVar71._4_4_ + 1.0;
            auVar63._8_4_ =
                 (fVar67 + 1.0 +
                 fVar67 * fVar67 *
                 (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                   0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5)) * auVar71._8_4_ + 1.0;
            auVar63._12_4_ =
                 (fVar68 + 1.0 +
                 fVar68 * fVar68 *
                 (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                   0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5)) * auVar71._12_4_ + 1.0;
            auVar71 = vrcpps_avx(auVar63);
            fVar61 = auVar71._0_4_;
            auVar64._0_4_ = auVar63._0_4_ * fVar61;
            fVar66 = auVar71._4_4_;
            auVar64._4_4_ = auVar63._4_4_ * fVar66;
            fVar67 = auVar71._8_4_;
            auVar64._8_4_ = auVar63._8_4_ * fVar67;
            fVar68 = auVar71._12_4_;
            auVar64._12_4_ = auVar63._12_4_ * fVar68;
            auVar71 = vsubps_avx(auVar53,auVar64);
            auVar65._0_4_ = fVar61 + fVar61 * auVar71._0_4_;
            auVar65._4_4_ = fVar66 + fVar66 * auVar71._4_4_;
            auVar65._8_4_ = fVar67 + fVar67 * auVar71._8_4_;
            auVar65._12_4_ = fVar68 + fVar68 * auVar71._12_4_;
            *pauVar8 = auVar65;
            pauVar8 = pauVar8 + 1;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar12);
    }
  }
  else if (0 < (int)uVar10) {
    uVar5 = 0;
    auVar60 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar75._8_8_ = 0x8000000000000000;
    auVar75._0_8_ = 0x8000000000000000;
    do {
      auVar56._8_4_ = 0x3c088908;
      auVar56._0_8_ = 0x3c0889083c088908;
      auVar51._8_4_ = 0xc2b0c0a5;
      auVar51._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar40._8_4_ = 0x42b0c0a5;
      auVar40._0_8_ = 0x42b0c0a542b0c0a5;
      auVar56._12_4_ = 0x3c088908;
      auVar51._12_4_ = 0xc2b0c0a5;
      auVar40._12_4_ = 0x42b0c0a5;
      auVar51._16_4_ = 0xc2b0c0a5;
      auVar45._16_4_ = 0x42b0c0a5;
      auVar45._0_16_ = auVar40;
      auVar51._20_4_ = 0xc2b0c0a5;
      auVar45._20_4_ = 0x42b0c0a5;
      auVar51._24_4_ = 0xc2b0c0a5;
      auVar45._24_4_ = 0x42b0c0a5;
      auVar51._28_4_ = 0xc2b0c0a5;
      auVar45._28_4_ = 0x42b0c0a5;
      pauVar13 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar11 < 8) {
        uVar10 = 0;
        auVar40 = auVar56;
      }
      else {
        iVar4 = 7;
        auVar54._8_4_ = 0x3f800000;
        auVar54._0_8_ = 0x3f8000003f800000;
        auVar54._12_4_ = 0x3f800000;
        do {
          auVar23._0_8_ = *(ulong *)*pauVar13 ^ 0x8000000080000000;
          auVar23._8_4_ = *(uint *)((long)*pauVar13 + 8) ^ 0x80000000;
          auVar23._12_4_ = *(uint *)((long)*pauVar13 + 0xc) ^ 0x80000000;
          auVar23._16_4_ = *(uint *)((long)*pauVar13 + 0x10) ^ 0x80000000;
          auVar23._20_4_ = *(uint *)((long)*pauVar13 + 0x14) ^ 0x80000000;
          auVar23._24_4_ = *(uint *)((long)*pauVar13 + 0x18) ^ 0x80000000;
          auVar23._28_4_ = *(uint *)((long)*pauVar13 + 0x1c) ^ 0x80000000;
          auVar55 = vminps_avx(auVar23,auVar45);
          auVar72 = vmaxps_avx(auVar55,auVar51);
          auVar46._0_4_ = auVar72._0_4_ * 1.442695 + 0.5;
          auVar46._4_4_ = auVar72._4_4_ * 1.442695 + 0.5;
          auVar46._8_4_ = auVar72._8_4_ * 1.442695 + 0.5;
          auVar46._12_4_ = auVar72._12_4_ * 1.442695 + 0.5;
          auVar46._16_4_ = auVar72._16_4_ * 1.442695 + 0.5;
          auVar46._20_4_ = auVar72._20_4_ * 1.442695 + 0.5;
          auVar46._24_4_ = auVar72._24_4_ * 1.442695 + 0.5;
          auVar46._28_4_ = 0x42b1c0a5;
          auVar1 = vroundps_avx(auVar46,1);
          auVar55 = vcmpps_avx(auVar46,auVar1,1);
          auVar55 = vandps_avx(auVar60._0_32_,auVar55);
          auVar55 = vsubps_avx(auVar1,auVar55);
          fVar61 = auVar72._0_4_ + auVar55._0_4_ * -0.6931472;
          fVar66 = auVar72._4_4_ + auVar55._4_4_ * -0.6931472;
          fVar67 = auVar72._8_4_ + auVar55._8_4_ * -0.6931472;
          fVar68 = auVar72._12_4_ + auVar55._12_4_ * -0.6931472;
          fVar35 = auVar72._16_4_ + auVar55._16_4_ * -0.6931472;
          fVar37 = auVar72._20_4_ + auVar55._20_4_ * -0.6931472;
          fVar38 = auVar72._24_4_ + auVar55._24_4_ * -0.6931472;
          auVar41._0_4_ = (int)auVar55._0_4_;
          auVar41._4_4_ = (int)auVar55._4_4_;
          auVar41._8_4_ = (int)auVar55._8_4_;
          auVar41._12_4_ = (int)auVar55._12_4_;
          auVar47._16_4_ = (int)auVar55._16_4_;
          auVar47._0_16_ = auVar41;
          auVar47._20_4_ = (int)auVar55._20_4_;
          auVar47._24_4_ = (int)auVar55._24_4_;
          auVar47._28_4_ = (int)auVar55._28_4_;
          auVar49 = vpslld_avx(auVar41,0x17);
          auVar71 = vpslld_avx(auVar47._16_16_,0x17);
          auVar71 = vpaddd_avx(auVar71,auVar54);
          auVar49 = vpaddd_avx(auVar49,auVar54);
          auVar24._0_4_ =
               auVar60._0_4_ +
               (auVar60._0_4_ + fVar61 +
               fVar61 * fVar61 *
               (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5)) * auVar49._0_4_;
          auVar24._4_4_ =
               auVar60._4_4_ +
               (auVar60._4_4_ + fVar66 +
               fVar66 * fVar66 *
               (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                 0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5)) * auVar49._4_4_;
          auVar24._8_4_ =
               auVar60._8_4_ +
               (auVar60._8_4_ + fVar67 +
               fVar67 * fVar67 *
               (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5)) * auVar49._8_4_;
          auVar24._12_4_ =
               auVar60._12_4_ +
               (auVar60._12_4_ + fVar68 +
               fVar68 * fVar68 *
               (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                 0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5)) * auVar49._12_4_;
          auVar24._16_4_ =
               auVar60._16_4_ +
               (auVar60._16_4_ + fVar35 +
               fVar35 * fVar35 *
               (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
                 0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar71._0_4_;
          auVar24._20_4_ =
               auVar60._20_4_ +
               (auVar60._20_4_ + fVar37 +
               fVar37 * fVar37 *
               (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar71._4_4_;
          auVar24._24_4_ =
               auVar60._24_4_ +
               (auVar60._24_4_ + fVar38 +
               fVar38 * fVar38 *
               (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                 0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar71._8_4_;
          auVar24._28_4_ =
               auVar60._28_4_ + auVar60._28_4_ + auVar72._28_4_ + auVar1._28_4_ + auVar1._28_4_;
          auVar55 = vrcpps_avx(auVar24);
          fVar61 = auVar55._0_4_;
          fVar66 = auVar55._4_4_;
          auVar2._4_4_ = auVar24._4_4_ * fVar66;
          auVar2._0_4_ = auVar24._0_4_ * fVar61;
          fVar67 = auVar55._8_4_;
          auVar2._8_4_ = auVar24._8_4_ * fVar67;
          fVar68 = auVar55._12_4_;
          auVar2._12_4_ = auVar24._12_4_ * fVar68;
          fVar35 = auVar55._16_4_;
          auVar2._16_4_ = auVar24._16_4_ * fVar35;
          fVar37 = auVar55._20_4_;
          auVar2._20_4_ = auVar24._20_4_ * fVar37;
          fVar38 = auVar55._24_4_;
          auVar2._24_4_ = auVar24._24_4_ * fVar38;
          auVar2._28_4_ = auVar24._28_4_;
          auVar72 = vsubps_avx(auVar60._0_32_,auVar2);
          auVar25._0_4_ = fVar61 + fVar61 * auVar72._0_4_;
          auVar25._4_4_ = fVar66 + fVar66 * auVar72._4_4_;
          auVar25._8_4_ = fVar67 + fVar67 * auVar72._8_4_;
          auVar25._12_4_ = fVar68 + fVar68 * auVar72._12_4_;
          auVar25._16_4_ = fVar35 + fVar35 * auVar72._16_4_;
          auVar25._20_4_ = fVar37 + fVar37 * auVar72._20_4_;
          auVar25._24_4_ = fVar38 + fVar38 * auVar72._24_4_;
          auVar25._28_4_ = auVar55._28_4_ + auVar72._28_4_;
          *pauVar13 = auVar25;
          pauVar13 = pauVar13 + 1;
          iVar4 = iVar4 + 8;
          uVar10 = uVar11 & 0xfffffff8;
        } while (iVar4 < (int)uVar11);
      }
      auVar36._8_4_ = 0x3f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._12_4_ = 0x3f800000;
      auVar57._8_4_ = 0x42b0c0a5;
      auVar57._0_8_ = 0x42b0c0a542b0c0a5;
      auVar57._12_4_ = 0x42b0c0a5;
      auVar58._8_4_ = 0xc2b0c0a5;
      auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar58._12_4_ = 0xc2b0c0a5;
      uVar7 = uVar10 | 3;
      while ((int)uVar7 < (int)uVar11) {
        auVar71 = *(undefined1 (*) [16])*pauVar13;
        auVar15._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
        auVar15._8_4_ = auVar71._8_4_ ^ 0x80000000;
        auVar15._12_4_ = auVar71._12_4_ ^ 0x80000000;
        auVar71 = vminps_avx(auVar15,auVar57);
        auVar40 = vmaxps_avx(auVar58,auVar71);
        auVar42._0_4_ = auVar40._0_4_ * 1.442695 + 0.5;
        auVar42._4_4_ = auVar40._4_4_ * 1.442695 + 0.5;
        auVar42._8_4_ = auVar40._8_4_ * 1.442695 + 0.5;
        auVar42._12_4_ = auVar40._12_4_ * 1.442695 + 0.5;
        auVar50._0_4_ = (int)auVar42._0_4_;
        auVar50._4_4_ = (int)auVar42._4_4_;
        auVar50._8_4_ = (int)auVar42._8_4_;
        auVar50._12_4_ = (int)auVar42._12_4_;
        auVar49 = vcvtdq2ps_avx(auVar50);
        auVar71 = vcmpps_avx(auVar42,auVar49,1);
        auVar71 = vandps_avx(auVar71,auVar36);
        auVar71 = vsubps_avx(auVar49,auVar71);
        fVar61 = auVar40._0_4_ + auVar71._0_4_ * -0.6931472;
        fVar66 = auVar40._4_4_ + auVar71._4_4_ * -0.6931472;
        fVar67 = auVar40._8_4_ + auVar71._8_4_ * -0.6931472;
        fVar68 = auVar40._12_4_ + auVar71._12_4_ * -0.6931472;
        auVar40._8_4_ = 0x3e2aaaaa;
        auVar40._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar40._12_4_ = 0x3e2aaaaa;
        auVar43._0_4_ = (int)auVar71._0_4_;
        auVar43._4_4_ = (int)auVar71._4_4_;
        auVar43._8_4_ = (int)auVar71._8_4_;
        auVar43._12_4_ = (int)auVar71._12_4_;
        auVar71 = vpslld_avx(auVar43,0x17);
        auVar71 = vpaddd_avx(auVar71,auVar36);
        auVar16._0_4_ =
             (fVar61 + 1.0 +
             fVar61 * fVar61 *
             (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
               0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5)) * auVar71._0_4_ + 1.0;
        auVar16._4_4_ =
             (fVar66 + 1.0 +
             fVar66 * fVar66 *
             (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
               0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5)) * auVar71._4_4_ + 1.0;
        auVar16._8_4_ =
             (fVar67 + 1.0 +
             fVar67 * fVar67 *
             (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
               0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5)) * auVar71._8_4_ + 1.0;
        auVar16._12_4_ =
             (fVar68 + 1.0 +
             fVar68 * fVar68 *
             (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
               0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5)) * auVar71._12_4_ + 1.0;
        auVar71 = vrcpps_avx(auVar16);
        fVar61 = auVar71._0_4_;
        auVar17._0_4_ = auVar16._0_4_ * fVar61;
        fVar66 = auVar71._4_4_;
        auVar17._4_4_ = auVar16._4_4_ * fVar66;
        fVar67 = auVar71._8_4_;
        auVar17._8_4_ = auVar16._8_4_ * fVar67;
        fVar68 = auVar71._12_4_;
        auVar17._12_4_ = auVar16._12_4_ * fVar68;
        auVar71 = vsubps_avx(auVar36,auVar17);
        auVar18._0_4_ = fVar61 + fVar61 * auVar71._0_4_;
        auVar18._4_4_ = fVar66 + fVar66 * auVar71._4_4_;
        auVar18._8_4_ = fVar67 + fVar67 * auVar71._8_4_;
        auVar18._12_4_ = fVar68 + fVar68 * auVar71._12_4_;
        *(undefined1 (*) [16])*pauVar13 = auVar18;
        pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 0x10);
        uVar7 = uVar10 + 7;
        uVar10 = uVar10 + 4;
      }
      auVar71 = vpcmpeqd_avx(auVar40,auVar40);
      if ((int)uVar10 < (int)uVar11) {
        uVar6 = CONCAT44(0,~uVar10 + uVar11);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar6;
        auVar56 = vpshufd_avx(auVar19,0x44);
        auVar49 = vorps_avx(auVar56,auVar75);
        auVar40 = vorps_avx(auVar56,auVar75);
        uVar14 = 0;
        auVar55 = _DAT_003152c0;
        do {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar14;
          auVar54 = vpshufd_avx(auVar20,0x44);
          auVar26._16_16_ = auVar54;
          auVar26._0_16_ = auVar54;
          auVar72 = vorps_avx(auVar26,_DAT_003152a0);
          auVar55 = vorps_avx(auVar26,auVar55);
          auVar36 = vpor_avx(auVar56,auVar75);
          auVar54 = vpcmpgtq_avx(auVar55._16_16_ ^ auVar75,auVar36);
          auVar41 = vpcmpgtq_avx(auVar55._0_16_ ^ auVar75,auVar49);
          auVar54 = vpackssdw_avx(auVar41,auVar54);
          auVar41 = vpcmpgtq_avx(auVar72._16_16_ ^ auVar75,auVar36);
          auVar44._0_8_ = auVar72._0_8_ ^ 0x8000000000000000;
          auVar44._8_4_ = auVar72._8_4_;
          auVar44._12_4_ = auVar72._12_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar44,auVar40);
          auVar41 = vpackssdw_avx(auVar36,auVar41);
          auVar54 = vpackssdw_avx(auVar41 ^ auVar71,auVar54 ^ auVar71);
          auVar41 = vpmovsxwd_avx(auVar54);
          auVar54 = vpunpckhwd_avx(auVar54,auVar54);
          auVar27._16_16_ = auVar54;
          auVar27._0_16_ = auVar41;
          auVar55 = vmaskmovps_avx(auVar27,*(undefined1 (*) [32])((long)*pauVar13 + uVar14 * 4));
          auVar21._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
          auVar21._8_4_ = auVar55._8_4_ ^ 0x80000000;
          auVar21._12_4_ = auVar55._12_4_ ^ 0x80000000;
          auVar28._16_4_ = -auVar55._16_4_;
          auVar28._0_16_ = auVar21;
          auVar28._20_4_ = auVar55._20_4_ ^ 0x80000000;
          auVar28._24_4_ = auVar55._24_4_ ^ 0x80000000;
          auVar28._28_4_ = auVar55._28_4_ ^ 0x80000000;
          auVar36 = auVar28._16_16_;
          local_108._0_4_ = expf(auVar28._16_4_);
          local_108._4_4_ = extraout_XMM0_Db;
          local_108._8_4_ = extraout_XMM0_Dc;
          local_108._12_4_ = extraout_XMM0_Dd;
          auVar54 = vpermilps_avx(auVar36,0xf5);
          auVar60._0_4_ = expf(auVar54._0_4_);
          auVar60._4_60_ = extraout_var;
          auVar54 = vinsertps_avx(local_108,auVar60._0_16_,0x10);
          auVar41 = vpermilps_avx(auVar36,0x4e);
          auVar52._0_4_ = expf(auVar41._0_4_);
          auVar52._4_60_ = extraout_var_00;
          auVar54 = vinsertps_avx(auVar54,auVar52._0_16_,0x20);
          auVar41 = vpermilps_avx(auVar36,0xff);
          auVar31._0_4_ = expf(auVar41._0_4_);
          auVar31._4_60_ = extraout_var_01;
          auVar54 = vinsertps_avx(auVar54,auVar31._0_16_,0x30);
          local_b8 = (float)auVar21._0_8_;
          local_108._0_4_ = expf(local_b8);
          local_108._4_4_ = extraout_XMM0_Db_00;
          local_108._8_4_ = extraout_XMM0_Dc_00;
          local_108._12_4_ = extraout_XMM0_Dd_00;
          auVar41 = vpermilps_avx(auVar21,0xf5);
          auVar32._0_4_ = expf(auVar41._0_4_);
          auVar32._4_60_ = extraout_var_02;
          auVar41 = vinsertps_avx(local_108,auVar32._0_16_,0x10);
          auVar36 = vpermilps_avx(auVar21,0x4e);
          auVar33._0_4_ = expf(auVar36._0_4_);
          auVar33._4_60_ = extraout_var_03;
          auVar41 = vinsertps_avx(auVar41,auVar33._0_16_,0x20);
          auVar36 = vpermilps_avx(auVar21,0xff);
          auVar34._0_4_ = expf(auVar36._0_4_);
          auVar55 = _DAT_003152c0;
          auVar34._4_60_ = extraout_var_04;
          auVar71 = vpcmpeqd_avx(auVar71,auVar71);
          auVar59._8_4_ = 0x3f800000;
          auVar59._0_8_ = 0x3f8000003f800000;
          auVar59._12_4_ = 0x3f800000;
          auVar59._16_4_ = 0x3f800000;
          auVar59._20_4_ = 0x3f800000;
          auVar59._24_4_ = 0x3f800000;
          auVar59._28_4_ = 0x3f800000;
          auVar60 = ZEXT3264(auVar59);
          auVar41 = vinsertps_avx(auVar41,auVar34._0_16_,0x30);
          auVar29._0_4_ = auVar41._0_4_ + 1.0;
          auVar29._4_4_ = auVar41._4_4_ + 1.0;
          auVar29._8_4_ = auVar41._8_4_ + 1.0;
          auVar29._12_4_ = auVar41._12_4_ + 1.0;
          auVar29._16_4_ = auVar54._0_4_ + 1.0;
          auVar29._20_4_ = auVar54._4_4_ + 1.0;
          auVar29._24_4_ = auVar54._8_4_ + 1.0;
          auVar29._28_4_ = auVar54._12_4_ + 1.0;
          auVar72 = vrcpps_avx(auVar29);
          fVar61 = auVar72._0_4_;
          fVar66 = auVar72._4_4_;
          auVar3._4_4_ = auVar29._4_4_ * fVar66;
          auVar3._0_4_ = auVar29._0_4_ * fVar61;
          fVar67 = auVar72._8_4_;
          auVar3._8_4_ = auVar29._8_4_ * fVar67;
          fVar68 = auVar72._12_4_;
          auVar3._12_4_ = auVar29._12_4_ * fVar68;
          fVar35 = auVar72._16_4_;
          auVar3._16_4_ = auVar29._16_4_ * fVar35;
          fVar37 = auVar72._20_4_;
          auVar3._20_4_ = auVar29._20_4_ * fVar37;
          fVar38 = auVar72._24_4_;
          auVar3._24_4_ = auVar29._24_4_ * fVar38;
          auVar3._28_4_ = auVar29._28_4_;
          auVar1 = vsubps_avx(auVar59,auVar3);
          auVar30._0_4_ = fVar61 + fVar61 * auVar1._0_4_;
          auVar30._4_4_ = fVar66 + fVar66 * auVar1._4_4_;
          auVar30._8_4_ = fVar67 + fVar67 * auVar1._8_4_;
          auVar30._12_4_ = fVar68 + fVar68 * auVar1._12_4_;
          auVar30._16_4_ = fVar35 + fVar35 * auVar1._16_4_;
          auVar30._20_4_ = fVar37 + fVar37 * auVar1._20_4_;
          auVar30._24_4_ = fVar38 + fVar38 * auVar1._24_4_;
          auVar30._28_4_ = auVar72._28_4_ + auVar1._28_4_;
          auVar72 = vmaskmovps_avx(auVar27,auVar30);
          *(undefined1 (*) [32])((long)*pauVar13 + uVar14 * 4) = auVar72;
          uVar14 = uVar14 + 8;
        } while ((uVar6 + 8 & 0xfffffffffffffff8) != uVar14);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar12);
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, sigmoid_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, sigmoid_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, sigmoid_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, sigmoid_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));

            ptr++;
        }
    }

    return 0;
}